

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::initialize(WindowImplX11 *this)

{
  XIM p_Var1;
  XIC p_Var2;
  ostream *poVar3;
  Atom AVar4;
  Atom AVar5;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  Lock lock;
  WindowImplX11 *local_30;
  Atom wmWindowTypeNormal;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  p_Var1 = OpenXIM();
  this->m_inputMethod = p_Var1;
  if (p_Var1 == (XIM)0x0) {
    this->m_inputContext = (XIC)0x0;
  }
  else {
    uVar6 = 0;
    p_Var2 = (XIC)XCreateIC(p_Var1,"clientWindow",this->m_window,"focusWindow",this->m_window,
                            "inputStyle",0x408,0);
    this->m_inputContext = p_Var2;
    if (p_Var2 != (XIC)0x0) goto LAB_00179fb4;
  }
  poVar3 = err();
  poVar3 = std::operator<<(poVar3,
                           "Failed to create input context for window -- TextEntered event won\'t be able to return unicode"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00179fb4:
  std::__cxx11::string::string
            ((string *)&lock,"_NET_WM_WINDOW_TYPE",(allocator *)&wmWindowTypeNormal);
  AVar4 = getAtom((string *)&lock,false);
  std::__cxx11::string::~string((string *)&lock);
  std::__cxx11::string::string((string *)&lock,"_NET_WM_WINDOW_TYPE_NORMAL",(allocator *)&local_30);
  AVar5 = getAtom((string *)&lock,false);
  std::__cxx11::string::~string((string *)&lock);
  wmWindowTypeNormal = AVar5;
  if (AVar5 != 0 && AVar4 != 0) {
    XChangeProperty(this->m_display,this->m_window,AVar4,4,0x20,0,(allocator *)&wmWindowTypeNormal,
                    CONCAT44(uVar6,1));
  }
  (*(this->super_WindowImpl)._vptr_WindowImpl[9])(this,1);
  grabFocus(this);
  createHiddenCursor(this);
  XFlush(this->m_display);
  Lock::Lock(&lock,(Mutex *)&(anonymous_namespace)::WindowsImplX11Impl::allWindowsMutex);
  local_30 = this;
  std::vector<sf::priv::WindowImplX11*,std::allocator<sf::priv::WindowImplX11*>>::
  emplace_back<sf::priv::WindowImplX11*>
            ((vector<sf::priv::WindowImplX11*,std::allocator<sf::priv::WindowImplX11*>> *)
             &(anonymous_namespace)::WindowsImplX11Impl::allWindows,&local_30);
  Lock::~Lock(&lock);
  return;
}

Assistant:

void WindowImplX11::initialize()
{
    using namespace WindowsImplX11Impl;

    // Create the input context
    m_inputMethod = OpenXIM();

    if (m_inputMethod)
    {
        m_inputContext = XCreateIC(m_inputMethod,
                                   XNClientWindow,
                                   m_window,
                                   XNFocusWindow,
                                   m_window,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   NULL);
    }
    else
    {
        m_inputContext = NULL;
    }

    if (!m_inputContext)
        err() << "Failed to create input context for window -- TextEntered event won't be able to return unicode" << std::endl;

    Atom wmWindowType = getAtom("_NET_WM_WINDOW_TYPE", false);
    Atom wmWindowTypeNormal = getAtom("_NET_WM_WINDOW_TYPE_NORMAL", false);

    if (wmWindowType && wmWindowTypeNormal)
    {
        XChangeProperty(m_display,
                        m_window,
                        wmWindowType,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&wmWindowTypeNormal),
                        1);
    }

    // Show the window
    setVisible(true);

    // Raise the window and grab input focus
    grabFocus();

    // Create the hidden cursor
    createHiddenCursor();

    // Flush the commands queue
    XFlush(m_display);

    // Add this window to the global list of windows (required for focus request)
    Lock lock(allWindowsMutex);
    allWindows.push_back(this);
}